

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstructCondense<double>::Contribute_Kc
          (TPZDohrSubstructCondense<double> *this,TPZMatrix<double> *Kc,TPZVec<int> *coarseindex)

{
  double dVar1;
  int iVar2;
  TPZFMatrix<double> *this_00;
  int64_t iVar3;
  long row;
  int *piVar4;
  double *pdVar5;
  TPZVec<int> *in_RDX;
  long *in_RSI;
  long in_RDI;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  do {
    this_00 = (TPZFMatrix<double> *)(long)local_1c;
    iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x20));
    if (iVar3 <= (long)this_00) {
      return;
    }
    local_20 = 0;
    while( true ) {
      row = (long)local_20;
      iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x20));
      if (iVar3 <= row) break;
      iVar2 = (**(code **)(*in_RSI + 0x80))();
      if (iVar2 == 0) {
LAB_01fa8141:
        iVar2 = (**(code **)(*in_RSI + 0x80))();
        if (iVar2 == 0) goto LAB_01fa8154;
      }
      else {
        piVar4 = TPZVec<int>::operator[](in_RDX,(long)local_20);
        in_stack_ffffffffffffffc4 = *piVar4;
        piVar4 = TPZVec<int>::operator[](in_RDX,(long)local_1c);
        if (in_stack_ffffffffffffffc4 < *piVar4) goto LAB_01fa8141;
LAB_01fa8154:
        pdVar5 = TPZFMatrix<double>::operator()
                           (this_00,row,
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        dVar1 = *pdVar5;
        TPZVec<int>::operator[](in_RDX,(long)local_1c);
        TPZVec<int>::operator[](in_RDX,(long)local_20);
        pdVar5 = TPZMatrix<double>::operator()
                           (&this_00->super_TPZMatrix<double>,row,
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        *pdVar5 = dVar1 + *pdVar5;
      }
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Contribute_Kc(TPZMatrix<TVar> &Kc, TPZVec<int> &coarseindex) {
	int i;
	int j;
	for (i=0;i<fCoarseNodes.NElements();i++) {
		for (j=0;j<fCoarseNodes.NElements();j++) {
			if ((Kc.IsSymmetric() && coarseindex[j] >= coarseindex[i]) || !Kc.IsSymmetric()) {
				Kc(coarseindex[i],coarseindex[j]) += fKCi(i,j);				
			}
		}
	}
}